

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitrate.c
# Opt level: O1

void vorbis_bitrate_init(vorbis_info *vi,bitrate_manager_state *bm)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  puVar1 = (ulong *)vi->codec_setup;
  bm->vb = (vorbis_block *)0x0;
  *(undefined8 *)&bm->choice = 0;
  bm->short_per_long = 0;
  bm->avgfloat = 0.0;
  bm->min_bitsper = 0;
  bm->max_bitsper = 0;
  bm->minmax_reservoir = 0;
  bm->avg_bitsper = 0;
  *(undefined8 *)bm = 0;
  bm->avg_reservoir = 0;
  uVar2 = puVar1[0x2ab];
  if (0 < (long)uVar2) {
    uVar3 = *puVar1;
    dVar6 = (double)vi->rate;
    bm->short_per_long = (long)puVar1[1] / (long)uVar3;
    bm->managed = 1;
    dVar7 = (double)(int)(uVar3 >> 1);
    dVar4 = rint(((double)(long)puVar1[0x2a8] * dVar7) / dVar6);
    bm->avg_bitsper = (long)dVar4;
    dVar4 = rint(((double)(long)puVar1[0x2a9] * dVar7) / dVar6);
    bm->min_bitsper = (long)dVar4;
    dVar4 = rint(((double)(long)puVar1[0x2aa] * dVar7) / dVar6);
    bm->max_bitsper = (long)dVar4;
    bm->avgfloat = 7.0;
    lVar5 = (long)((double)(long)uVar2 * (double)puVar1[0x2ac]);
    bm->minmax_reservoir = lVar5;
    bm->avg_reservoir = lVar5;
  }
  return;
}

Assistant:

void vorbis_bitrate_init(vorbis_info *vi,bitrate_manager_state *bm){
  codec_setup_info *ci=vi->codec_setup;
  bitrate_manager_info *bi=&ci->bi;

  memset(bm,0,sizeof(*bm));

  if(bi && (bi->reservoir_bits>0)){
    long ratesamples=vi->rate;
    int  halfsamples=ci->blocksizes[0]>>1;

    bm->short_per_long=ci->blocksizes[1]/ci->blocksizes[0];
    bm->managed=1;

    bm->avg_bitsper= rint(1.*bi->avg_rate*halfsamples/ratesamples);
    bm->min_bitsper= rint(1.*bi->min_rate*halfsamples/ratesamples);
    bm->max_bitsper= rint(1.*bi->max_rate*halfsamples/ratesamples);

    bm->avgfloat=PACKETBLOBS/2;

    /* not a necessary fix, but one that leads to a more balanced
       typical initialization */
    {
      long desired_fill=bi->reservoir_bits*bi->reservoir_bias;
      bm->minmax_reservoir=desired_fill;
      bm->avg_reservoir=desired_fill;
    }

  }
}